

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

void Cec3_SetDefaultParams(Cec3_Par_t *p)

{
  Cec3_Par_t *p_local;
  
  memset(p,0,0x20);
  p->nSimWords = 0xc;
  p->nSimRounds = 4;
  p->nItersMax = 10;
  p->nConfLimit = 1000;
  p->fIsMiter = 0;
  p->fUseCones = 0;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  return;
}

Assistant:

void Cec3_SetDefaultParams( Cec3_Par_t * p )
{
    memset( p, 0, sizeof(Cec3_Par_t) );
    p->nSimWords      =      12;    // simulation words
    p->nSimRounds     =       4;    // simulation rounds
    p->nItersMax      =      10;    // max number of iterations
    p->nConfLimit     =    1000;    // conflict limit at a node
    p->fIsMiter       =       0;    // this is a miter
    p->fUseCones      =       0;    // use logic cones
    p->fVeryVerbose   =       0;    // verbose stats
    p->fVerbose       =       0;    // verbose stats
}